

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O1

adjusted_mantissa
duckdb_fast_float::parse_long_mantissa<duckdb_fast_float::binary_format<float>>
          (char *first,char *last)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  adjusted_mantissa aVar10;
  decimal answer;
  decimal local_320;
  
  local_320.negative = *first == '-';
  local_320.truncated = false;
  pbVar3 = (byte *)(first + local_320.negative);
  pbVar4 = pbVar3;
  for (; (pbVar3 != (byte *)last && (pbVar4 = pbVar3, *pbVar3 == 0x30)); pbVar3 = pbVar3 + 1) {
    pbVar4 = (byte *)last;
  }
  local_320.num_digits = 0;
  local_320.decimal_point = 0;
  if (pbVar4 != (byte *)last) {
    uVar5 = ~(uint)pbVar4;
    do {
      bVar8 = *pbVar4 - 0x30;
      if (9 < bVar8) {
        if (*pbVar4 == 0x2e) {
          pbVar3 = pbVar4 + 1;
          pbVar4 = pbVar3;
          if ((local_320.num_digits != 0) || (pbVar3 == (byte *)last)) goto LAB_00d8611b;
          goto LAB_00d860e8;
        }
        break;
      }
      if (local_320.num_digits < 0x300) {
        local_320.digits[local_320.num_digits] = bVar8;
      }
      local_320.num_digits = local_320.num_digits + 1;
      pbVar4 = pbVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (pbVar4 != (byte *)last);
  }
  goto LAB_00d86036;
  while (pbVar3 = pbVar3 + 1, pbVar4 = (byte *)last, pbVar3 != (byte *)last) {
LAB_00d860e8:
    pbVar4 = pbVar3;
    if (*pbVar3 != 0x30) break;
  }
LAB_00d8611b:
  do {
    if ((last < pbVar4 + 8) || (0x2ff < local_320.num_digits + 8)) break;
    uVar9 = *(long *)pbVar4 + 0xcfcfcfcfcfcfcfd0;
    uVar7 = *(long *)pbVar4 + 0x4646464646464646U | uVar9;
    if ((uVar7 & 0x8080808080808080) == 0) {
      *(ulong *)(local_320.digits + local_320.num_digits) = uVar9;
      pbVar4 = pbVar4 + 8;
      local_320.num_digits = local_320.num_digits + 8;
    }
  } while ((uVar7 & 0x8080808080808080) == 0);
  for (; (pbVar4 != (byte *)last && ((byte)(*pbVar4 - 0x30) < 10)); pbVar4 = pbVar4 + 1) {
    if (local_320.num_digits < 0x300) {
      local_320.digits[local_320.num_digits] = *pbVar4 - 0x30;
    }
    local_320.num_digits = local_320.num_digits + 1;
  }
  local_320.decimal_point = -(uVar5 + (int)pbVar4);
LAB_00d86036:
  if (local_320.num_digits != 0) {
    iVar6 = 0;
    pbVar3 = pbVar4;
    while( true ) {
      pbVar3 = pbVar3 + -1;
      bVar8 = *pbVar3;
      if ((bVar8 != 0x30) && (bVar8 != 0x2e)) break;
      iVar6 = iVar6 + (uint)(bVar8 == 0x30);
    }
    local_320.decimal_point = local_320.decimal_point + local_320.num_digits;
    local_320.num_digits = local_320.num_digits - iVar6;
  }
  if (0x300 < local_320.num_digits) {
    local_320.truncated = true;
    local_320.num_digits = 0x300;
  }
  if ((pbVar4 == (byte *)last) || ((*pbVar4 | 0x20) != 0x65)) goto LAB_00d861b4;
  pbVar3 = pbVar4 + 1;
  iVar6 = 0;
  if (pbVar3 == (byte *)last) {
LAB_00d86172:
    bVar1 = false;
  }
  else {
    if (*pbVar3 != 0x2d) {
      if (*pbVar3 == 0x2b) {
        pbVar3 = pbVar4 + 2;
      }
      goto LAB_00d86172;
    }
    bVar1 = true;
    pbVar3 = pbVar4 + 2;
  }
  if (pbVar3 != (byte *)last) {
    iVar6 = 0;
    do {
      if (9 < (byte)(*pbVar3 - 0x30)) break;
      iVar2 = (uint)(byte)(*pbVar3 - 0x30) + iVar6 * 10;
      if (0xffff < iVar6) {
        iVar2 = iVar6;
      }
      iVar6 = iVar2;
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)last);
  }
  iVar2 = -iVar6;
  if (!bVar1) {
    iVar2 = iVar6;
  }
  local_320.decimal_point = local_320.decimal_point + iVar2;
LAB_00d861b4:
  if ((ulong)local_320.num_digits < 0x13) {
    switchD_0105b559::default
              (local_320.digits + local_320.num_digits,0,(ulong)(0x12 - local_320.num_digits) + 1);
  }
  aVar10 = compute_float<duckdb_fast_float::binary_format<float>>(&local_320);
  return aVar10;
}

Assistant:

fastfloat_really_inline decimal parse_decimal(const char *p, const char *pend, const char decimal_separator = '.') noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if (*p == '-') { // C++17 20.19.3.(7.1) explicitly forbids '+' sign here
    ++p;
  }
  // skip leading zeroes
  while ((p != pend) && (*p == '0')) {
    ++p;
  }
  while ((p != pend) && is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if ((p != pend) && (*p == decimal_separator)) {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if(answer.num_digits == 0) {
      // skip zeros
      while ((p != pend) && (*p == '0')) {
       ++p;
      }
    }
    // We expect that this loop will often take the bulk of the running time
    // because when a value has lots of digits, these digits often
    while ((p + 8 <= pend) && (answer.num_digits + 8 < max_digits)) {
      uint64_t val = read_u64(p);
      if(! is_made_of_eight_digits_fast(val)) { break; }
      // We have eight digits, process them in one go!
      val -= 0x3030303030303030;
      write_u64(answer.digits + answer.num_digits, val);
      answer.num_digits += 8;
      p += 8;
    }
    while ((p != pend) && is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  // We want num_digits to be the number of significant digits, excluding
  // leading *and* trailing zeros! Otherwise the truncated flag later is
  // going to be misleading.
  if(answer.num_digits > 0) {
    // We potentially need the answer.num_digits > 0 guard because we
    // prune leading zeros. So with answer.num_digits > 0, we know that
    // we have at least one non-zero digit.
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == decimal_separator)) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits) {
    answer.truncated = true;
    answer.num_digits = max_digits;
  }
  if ((p != pend) && (('e' == *p) || ('E' == *p))) {
    ++p;
    bool neg_exp = false;
    if ((p != pend) && ('-' == *p)) {
      neg_exp = true;
      ++p;
    } else if ((p != pend) && ('+' == *p)) { // '+' on exponent is allowed by C++17 20.19.3.(7.1)
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while ((p != pend) && is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  // In very rare cases, we may have fewer than 19 digits, we want to be able to reliably
  // assume that all digits up to max_digit_without_overflow have been initialized.
  for(uint32_t i = answer.num_digits; i < max_digit_without_overflow; i++) { answer.digits[i] = 0; }

  return answer;
}